

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O1

_Bool ppk_encrypted_s(BinarySource *src,char **commentptr)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  char *ptr;
  _Bool _Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  char header [40];
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  char cStack_38;
  char cStack_37;
  char cStack_36;
  char cStack_35;
  char cStack_34;
  char cStack_33;
  
  if (commentptr != (char **)0x0) {
    *commentptr = (char *)0x0;
  }
  _Var1 = read_header(src,&local_48);
  if ((_Var1) &&
     ((((auVar7[0] = -(cStack_42 == 'U'), auVar7[1] = -(cStack_41 == 's'),
        auVar7[2] = -(cStack_40 == 'e'), auVar7[3] = -(cStack_3f == 'r'),
        auVar7[4] = -(cStack_3e == '-'), auVar7[5] = -(cStack_3d == 'K'),
        auVar7[6] = -(cStack_3c == 'e'), auVar7[7] = -(cStack_3b == 'y'),
        auVar7[8] = -(cStack_3a == '-'), auVar7[9] = -(cStack_39 == 'F'),
        auVar7[10] = -(cStack_38 == 'i'), auVar7[0xb] = -(cStack_37 == 'l'),
        auVar7[0xc] = -(cStack_36 == 'e'), auVar7[0xd] = -(cStack_35 == '-'),
        auVar7[0xe] = -(cStack_34 == '3'), auVar7[0xf] = -(cStack_33 == '\0'),
        auVar5[0] = -(local_48 == 'P'), auVar5[1] = -(cStack_47 == 'u'),
        auVar5[2] = -(cStack_46 == 'T'), auVar5[3] = -(cStack_45 == 'T'),
        auVar5[4] = -(cStack_44 == 'Y'), auVar5[5] = -(cStack_43 == '-'),
        auVar5[6] = -(cStack_42 == 'U'), auVar5[7] = -(cStack_41 == 's'),
        auVar5[8] = -(cStack_40 == 'e'), auVar5[9] = -(cStack_3f == 'r'),
        auVar5[10] = -(cStack_3e == '-'), auVar5[0xb] = -(cStack_3d == 'K'),
        auVar5[0xc] = -(cStack_3c == 'e'), auVar5[0xd] = -(cStack_3b == 'y'),
        auVar5[0xe] = -(cStack_3a == '-'), auVar5[0xf] = -(cStack_39 == 'F'),
        auVar5 = auVar5 & auVar7,
        (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff ||
        (auVar8[0] = -(cStack_42 == 'U'), auVar8[1] = -(cStack_41 == 's'),
        auVar8[2] = -(cStack_40 == 'e'), auVar8[3] = -(cStack_3f == 'r'),
        auVar8[4] = -(cStack_3e == '-'), auVar8[5] = -(cStack_3d == 'K'),
        auVar8[6] = -(cStack_3c == 'e'), auVar8[7] = -(cStack_3b == 'y'),
        auVar8[8] = -(cStack_3a == '-'), auVar8[9] = -(cStack_39 == 'F'),
        auVar8[10] = -(cStack_38 == 'i'), auVar8[0xb] = -(cStack_37 == 'l'),
        auVar8[0xc] = -(cStack_36 == 'e'), auVar8[0xd] = -(cStack_35 == '-'),
        auVar8[0xe] = -(cStack_34 == '2'), auVar8[0xf] = -(cStack_33 == '\0'),
        auVar10[0] = -(local_48 == 'P'), auVar10[1] = -(cStack_47 == 'u'),
        auVar10[2] = -(cStack_46 == 'T'), auVar10[3] = -(cStack_45 == 'T'),
        auVar10[4] = -(cStack_44 == 'Y'), auVar10[5] = -(cStack_43 == '-'),
        auVar10[6] = -(cStack_42 == 'U'), auVar10[7] = -(cStack_41 == 's'),
        auVar10[8] = -(cStack_40 == 'e'), auVar10[9] = -(cStack_3f == 'r'),
        auVar10[10] = -(cStack_3e == '-'), auVar10[0xb] = -(cStack_3d == 'K'),
        auVar10[0xc] = -(cStack_3c == 'e'), auVar10[0xd] = -(cStack_3b == 'y'),
        auVar10[0xe] = -(cStack_3a == '-'), auVar10[0xf] = -(cStack_39 == 'F'),
        auVar8 = auVar8 & auVar10,
        (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff)) ||
       (auVar6[0] = -(local_48 == 'P'), auVar6[1] = -(cStack_47 == 'u'),
       auVar6[2] = -(cStack_46 == 'T'), auVar6[3] = -(cStack_45 == 'T'),
       auVar6[4] = -(cStack_44 == 'Y'), auVar6[5] = -(cStack_43 == '-'),
       auVar6[6] = -(cStack_42 == 'U'), auVar6[7] = -(cStack_41 == 's'),
       auVar6[8] = -(cStack_40 == 'e'), auVar6[9] = -(cStack_3f == 'r'),
       auVar6[10] = -(cStack_3e == '-'), auVar6[0xb] = -(cStack_3d == 'K'),
       auVar6[0xc] = -(cStack_3c == 'e'), auVar6[0xd] = -(cStack_3b == 'y'),
       auVar6[0xe] = -(cStack_3a == '-'), auVar6[0xf] = -(cStack_39 == 'F'),
       auVar9[0] = -(cStack_42 == 'U'), auVar9[1] = -(cStack_41 == 's'),
       auVar9[2] = -(cStack_40 == 'e'), auVar9[3] = -(cStack_3f == 'r'),
       auVar9[4] = -(cStack_3e == '-'), auVar9[5] = -(cStack_3d == 'K'),
       auVar9[6] = -(cStack_3c == 'e'), auVar9[7] = -(cStack_3b == 'y'),
       auVar9[8] = -(cStack_3a == '-'), auVar9[9] = -(cStack_39 == 'F'),
       auVar9[10] = -(cStack_38 == 'i'), auVar9[0xb] = -(cStack_37 == 'l'),
       auVar9[0xc] = -(cStack_36 == 'e'), auVar9[0xd] = -(cStack_35 == '-'),
       auVar9[0xe] = -(cStack_34 == '1'), auVar9[0xf] = -(cStack_33 == '\0'),
       auVar9 = auVar9 & auVar6,
       (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff)) &&
      (pcVar3 = read_body(src), pcVar3 != (char *)0x0)))) {
    safefree(pcVar3);
    _Var1 = read_header(src,&local_48);
    if (((_Var1) &&
        (CONCAT17(cStack_3e,
                  CONCAT16(cStack_3f,
                           CONCAT15(cStack_40,
                                    CONCAT14(cStack_41,
                                             CONCAT13(cStack_42,
                                                      CONCAT12(cStack_43,
                                                               CONCAT11(cStack_44,cStack_45)))))))
         == 0x6e6f6974707972 &&
         CONCAT17(cStack_41,
                  CONCAT16(cStack_42,
                           CONCAT15(cStack_43,
                                    CONCAT14(cStack_44,
                                             CONCAT13(cStack_45,
                                                      CONCAT12(cStack_46,
                                                               CONCAT11(cStack_47,local_48))))))) ==
         0x6974707972636e45)) && (pcVar3 = read_body(src), pcVar3 != (char *)0x0)) {
      _Var1 = read_header(src,&local_48);
      _Var4 = true;
      if (((_Var1) &&
          (CONCAT17(cStack_41,
                    CONCAT16(cStack_42,
                             CONCAT15(cStack_43,
                                      CONCAT14(cStack_44,
                                               CONCAT13(cStack_45,
                                                        CONCAT12(cStack_46,
                                                                 CONCAT11(cStack_47,local_48)))))))
           == 0x746e656d6d6f43)) && (ptr = read_body(src), ptr != (char *)0x0)) {
        if (commentptr == (char **)0x0) {
          safefree(ptr);
        }
        else {
          *commentptr = ptr;
        }
        iVar2 = strcmp(pcVar3,"aes256-cbc");
        _Var4 = iVar2 == 0;
      }
      safefree(pcVar3);
      return _Var4;
    }
  }
  return false;
}

Assistant:

bool ppk_encrypted_s(BinarySource *src, char **commentptr)
{
    char header[40], *b, *comment;
    bool ret;

    if (commentptr)
        *commentptr = NULL;

    if (!read_header(src, header)
        || (0 != strcmp(header, "PuTTY-User-Key-File-3") &&
            0 != strcmp(header, "PuTTY-User-Key-File-2") &&
            0 != strcmp(header, "PuTTY-User-Key-File-1"))) {
        return false;
    }
    if ((b = read_body(src)) == NULL) {
        return false;
    }
    sfree(b);                          /* we don't care about key type here */
    /* Read the Encryption header line. */
    if (!read_header(src, header) || 0 != strcmp(header, "Encryption")) {
        return false;
    }
    if ((b = read_body(src)) == NULL) {
        return false;
    }

    /* Read the Comment header line. */
    if (!read_header(src, header) || 0 != strcmp(header, "Comment")) {
        sfree(b);
        return true;
    }
    if ((comment = read_body(src)) == NULL) {
        sfree(b);
        return true;
    }

    if (commentptr)
        *commentptr = comment;
    else
        sfree(comment);

    if (!strcmp(b, "aes256-cbc"))
        ret = true;
    else
        ret = false;
    sfree(b);
    return ret;
}